

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_cache.cc
# Opt level: O0

Status __thiscall
leveldb::TableCache::FindTable
          (TableCache *this,uint64_t file_number,uint64_t file_size,Handle **handle)

{
  bool bVar1;
  long lVar2;
  undefined8 *puVar3;
  long *in_R8;
  TableAndFile *tf;
  Status local_b8;
  Status local_b0;
  undefined1 local_a8 [8];
  string old_fname;
  Table *local_80;
  Table *table;
  RandomAccessFile *file;
  string fname;
  Slice key;
  char buf [8];
  Handle **handle_local;
  uint64_t file_size_local;
  uint64_t file_number_local;
  TableCache *this_local;
  Status *s;
  
  Status::Status((Status *)this);
  EncodeFixed64((char *)((long)&key.size_ + 7),file_size);
  Slice::Slice((Slice *)((long)&fname.field_2 + 8),(char *)((long)&key.size_ + 7),8);
  lVar2 = (**(code **)(**(long **)(file_number + 0x30) + 0x18))
                    (*(long **)(file_number + 0x30),(undefined1 *)((long)&fname.field_2 + 8));
  *in_R8 = lVar2;
  if (*in_R8 == 0) {
    TableFileName((string *)&file,(string *)(file_number + 8),file_size);
    table = (Table *)0x0;
    local_80 = (Table *)0x0;
    (**(code **)(**(long **)file_number + 0x18))
              ((undefined1 *)((long)&old_fname.field_2 + 8),*(long **)file_number,&file,&table);
    Status::operator=((Status *)this,(Status *)((long)&old_fname.field_2 + 8));
    Status::~Status((Status *)((long)&old_fname.field_2 + 8));
    bVar1 = Status::ok((Status *)this);
    if (!bVar1) {
      SSTTableFileName((string *)local_a8,(string *)(file_number + 8),file_size);
      (**(code **)(**(long **)file_number + 0x18))(&local_b0,*(long **)file_number,local_a8,&table);
      bVar1 = Status::ok(&local_b0);
      Status::~Status(&local_b0);
      if (bVar1) {
        Status::OK();
        Status::operator=((Status *)this,&local_b8);
        Status::~Status(&local_b8);
      }
      std::__cxx11::string::~string((string *)local_a8);
    }
    bVar1 = Status::ok((Status *)this);
    if (bVar1) {
      Table::Open((Table *)&tf,*(Options **)(file_number + 0x28),(RandomAccessFile *)table,
                  (uint64_t)handle,&local_80);
      Status::operator=((Status *)this,(Status *)&tf);
      Status::~Status((Status *)&tf);
    }
    bVar1 = Status::ok((Status *)this);
    if (bVar1) {
      puVar3 = (undefined8 *)operator_new(0x10);
      *puVar3 = table;
      puVar3[1] = local_80;
      lVar2 = (**(code **)(**(long **)(file_number + 0x30) + 0x10))
                        (*(long **)(file_number + 0x30),(undefined1 *)((long)&fname.field_2 + 8),
                         puVar3,1,DeleteEntry);
      *in_R8 = lVar2;
    }
    else {
      if (local_80 != (Table *)0x0) {
        __assert_fail("table == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/table_cache.cc"
                      ,0x40,
                      "Status leveldb::TableCache::FindTable(uint64_t, uint64_t, Cache::Handle **)")
        ;
      }
      if (table != (Table *)0x0) {
        (**(code **)&(table->rep_->options).create_if_missing)();
      }
    }
    std::__cxx11::string::~string((string *)&file);
  }
  return (Status)(char *)this;
}

Assistant:

Status TableCache::FindTable(uint64_t file_number, uint64_t file_size,
                             Cache::Handle** handle) {
  Status s;
  char buf[sizeof(file_number)];
  EncodeFixed64(buf, file_number);
  Slice key(buf, sizeof(buf));
  *handle = cache_->Lookup(key);
  if (*handle == nullptr) {
    std::string fname = TableFileName(dbname_, file_number);
    RandomAccessFile* file = nullptr;
    Table* table = nullptr;
    s = env_->NewRandomAccessFile(fname, &file);
    if (!s.ok()) {
      std::string old_fname = SSTTableFileName(dbname_, file_number);
      if (env_->NewRandomAccessFile(old_fname, &file).ok()) {
        s = Status::OK();
      }
    }
    if (s.ok()) {
      s = Table::Open(options_, file, file_size, &table);
    }

    if (!s.ok()) {
      assert(table == nullptr);
      delete file;
      // We do not cache error results so that if the error is transient,
      // or somebody repairs the file, we recover automatically.
    } else {
      TableAndFile* tf = new TableAndFile;
      tf->file = file;
      tf->table = table;
      *handle = cache_->Insert(key, tf, 1, &DeleteEntry);
    }
  }
  return s;
}